

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saxman.h
# Opt level: O0

bool ClownLZSS::Internal::Saxman::CompressWithHeader<ClownLZSS::CompressorOutput<std::ofstream>&>
               (uchar *data,size_t data_size,
               CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output)

{
  bool bVar1;
  streamoff sVar2;
  undefined1 local_48 [8];
  pos_type end_position;
  pos_type header_position;
  CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output_local;
  size_t data_size_local;
  uchar *data_local;
  
  join_0x00000010_0x00000000_ =
       OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
       ::Tell(&output->
               super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             );
  OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::WriteLE16((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
               *)output,0);
  bVar1 = Compress<std::ofstream>(data,data_size,output);
  if (bVar1) {
    _local_48 = OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                ::Tell(&output->
                        super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                      );
    OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::Seek(&output->
            super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
           ,(pos_type *)&end_position._M_state);
    sVar2 = std::fpos<__mbstate_t>::operator-
                      ((fpos<__mbstate_t> *)local_48,(fpos<__mbstate_t> *)&end_position._M_state);
    OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::WriteLE16((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 *)output,(int)sVar2 - 2);
    OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::Seek(&output->
            super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
           ,(pos_type *)local_48);
  }
  return bVar1;
}

Assistant:

inline bool CompressWithHeader(const unsigned char* const data, const std::size_t data_size, T &&output)
			{
				// Track the location of the header...
				const auto header_position = output.Tell();

				// ...and insert a placeholder there.
				output.WriteLE16(0);

				if (!Compress(data, data_size, output))
					return false;

				// Grab the current position for later.
				const auto end_position = output.Tell();

				// Rewind to the header...
				output.Seek(header_position);

				// ...and complete it.
				output.WriteLE16(end_position - header_position - 2);

				// Seek back to the end of the file just as the caller might expect us to do.
				output.Seek(end_position);

				return true;
			}